

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  long lVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  int i;
  int iVar5;
  bool bVar6;
  double in;
  undefined8 extraout_XMM0_Qb;
  double adStack_140 [5];
  double coeff [2] [6];
  double dStack_b8;
  SOSCascade<2,_Iir::DirectFormII> f;
  
  lVar1 = 0xc;
  pdVar3 = (double *)&DAT_00103030;
  pdVar4 = coeff[0];
  for (; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar4 = pdVar4 + 1;
  }
  adStack_140[0] = 5.20453691985628e-318;
  Iir::Custom::SOSCascade<2,_Iir::DirectFormII>::SOSCascade(&f,&coeff);
  for (lVar1 = 0x28; lVar1 != 0x88; lVar1 = lVar1 + 0x30) {
    adStack_140[0] = 5.20495193499878e-318;
    assert_print(-(uint)(*(double *)((long)adStack_140 + lVar1 + 0x18) ==
                        *(double *)((long)coeff[1] + lVar1 + 0x10)) & 1,"m_a0 mismatch.\n");
    adStack_140[0] = 5.20509521403608e-318;
    assert_print(-(uint)(*(double *)((long)coeff[-1] + lVar1 + 0x28) ==
                        *(double *)((long)coeff[1] + lVar1 + 0x18)) & 1,"m_a1 mismatch.\n");
    adStack_140[0] = 5.20523849307337e-318;
    assert_print(-(uint)(*(double *)((long)coeff[0] + lVar1) ==
                        *(double *)((long)coeff[1] + lVar1 + 0x20)) & 1,"m_a2 mismatch.\n");
    adStack_140[0] = 5.20539659408004e-318;
    assert_print(-(uint)(*(double *)((long)adStack_140 + lVar1) ==
                        *(double *)
                         ((long)&f.super_CascadeStages<2,_Iir::DirectFormII>.m_stages[0].m_a0 +
                         lVar1)) & 1,"m_b0 mismatch.\n");
    adStack_140[0] = 5.20553493246087e-318;
    assert_print(-(uint)(*(double *)((long)adStack_140 + lVar1 + 8) ==
                        *(double *)((long)coeff[1] + lVar1 + 0x28)) & 1,"m_b1 mismatch.\n");
    adStack_140[0] = 5.20569303346754e-318;
    assert_print(-(uint)(*(double *)((long)adStack_140 + lVar1 + 0x10) ==
                        *(double *)((long)&dStack_b8 + lVar1)) & 1,"m_b2 mismatch.\n");
  }
  iVar5 = 0;
  iVar2 = 10000;
  adStack_140[4] = 0.0;
  adStack_140[1] = 0.0;
  while( true ) {
    bVar6 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    adStack_140[2] = adStack_140[4];
    if (bVar6) break;
    in = 1.0;
    if (iVar5 != 10) {
      in = 0.0;
    }
    adStack_140[0] = 5.20608334532776e-318;
    adStack_140[3] =
         Iir::CascadeStages<2,_Iir::DirectFormII>::filter<double>
                   (&f.super_CascadeStages<2,_Iir::DirectFormII>,in);
    adStack_140[0] = 5.20620192108276e-318;
    adStack_140[4] = (double)extraout_XMM0_Qb;
    assert_print((uint)!NAN(adStack_140[3]),"Custom filter output is NAN\n");
    if (iVar5 - 0x15U < 0x4f) {
      adStack_140[0] = 5.20646871653151e-318;
      assert_print(-(uint)(adStack_140[1] != 0.0 || adStack_140[3] != 0.0) & 1,
                   "Custom output is zero\n");
    }
    iVar5 = iVar5 + 1;
    adStack_140[1] = adStack_140[3];
  }
  adStack_140[0] = 5.20664163950756e-318;
  fprintf(_stderr,"Final filter value: %e\n");
  adStack_140[0] = 5.20685408773527e-318;
  assert_print((uint)(ABS(adStack_140[1]) < 1e-25),"Custom filter value for t->inf to high!");
  return 0;
}

Assistant:

int main (int,char**)
{
	// generated with: "elliptic_design.py"
	const double coeff[][6] = {
		{1.665623674062209972e-02,
		 -3.924801366970616552e-03,
		 1.665623674062210319e-02,
		 1.000000000000000000e+00,
		 -1.715403014004022175e+00,
		 8.100474793174089472e-01},
		{1.000000000000000000e+00,
		 -1.369778997100624895e+00,
		 1.000000000000000222e+00,
		 1.000000000000000000e+00,
		 -1.605878925999785656e+00,
		 9.538657786383895054e-01}};

	Iir::Custom::SOSCascade<2> f(coeff);

	auto coeffRet = f.getCascadeStorage();
	for(int i = 0; i < 2; i++) {
	    assert_print(coeffRet.stageArray[i].m_a0 == coeff[i][3],"m_a0 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_a1 == coeff[i][4],"m_a1 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_a2 == coeff[i][5],"m_a2 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b0 == coeff[i][0],"m_b0 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b1 == coeff[i][1],"m_b1 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b2 == coeff[i][2],"m_b2 mismatch.\n");
	}

	double b = 0;
	double b2 = 0;
	for(int i=0;i<10000;i++) 
	{
		double a=0;
		if (i==10) a = 1;
		b2 = b;
		b = f.filter(a);
		assert_print(!isnan(b),"Custom filter output is NAN\n");
		if ((i>20) && (i<100)) {
			assert_print((b != 0) || (b2 != 0),
				     "Custom output is zero\n");
		}
	}
	fprintf(stderr,"Final filter value: %e\n",b);
	assert_print(fabs(b) < 1E-25,"Custom filter value for t->inf to high!");

	return 0;
}